

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
deqp::gles31::Functional::anon_unknown_1::genSetNthBitSampleMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,int nthBit)

{
  size_type __n;
  reference pvVar1;
  byte bVar2;
  int local_38;
  int ndx;
  allocator<unsigned_int> local_22;
  undefined1 local_21;
  int local_20;
  int local_1c;
  deUint32 topWordBits;
  int numWords;
  int wordSize;
  int nthBit_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *mask;
  
  topWordBits = 0x20;
  numWords = nthBit;
  _wordSize = __return_storage_ptr__;
  local_1c = getEffectiveSampleMaskWordCount(nthBit);
  local_20 = numWords + 0x20 + local_1c * -0x20;
  local_21 = 0;
  __n = (size_type)local_1c;
  std::allocator<unsigned_int>::allocator(&local_22);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,&local_22);
  std::allocator<unsigned_int>::~allocator(&local_22);
  for (local_38 = 0; local_38 < local_1c + -1; local_38 = local_38 + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(long)local_38);
    *pvVar1 = 0;
  }
  bVar2 = (byte)local_20;
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (__return_storage_ptr__,(long)(local_1c + -1));
  *pvVar1 = (value_type)(1L << (bVar2 & 0x3f));
  return __return_storage_ptr__;
}

Assistant:

static std::vector<deUint32> genSetNthBitSampleMask (int nthBit)
{
	const int				wordSize	= 32;
	const int				numWords	= getEffectiveSampleMaskWordCount(nthBit);
	const deUint32			topWordBits	= (deUint32)(nthBit - (numWords - 1) * wordSize);
	std::vector<deUint32>	mask		(numWords);

	for (int ndx = 0; ndx < numWords - 1; ++ndx)
		mask[ndx] = 0;

	mask[numWords - 1] = (deUint32)(1ULL << topWordBits);
	return mask;
}